

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O0

void __thiscall rcg::Device::~Device(Device *this)

{
  element_type *peVar1;
  element_type *this_00;
  int in_ESI;
  long in_RDI;
  vector<std::weak_ptr<rcg::Stream>,_std::allocator<std::weak_ptr<rcg::Stream>_>_>
  *in_stack_fffffffffffffff0;
  
  if (0 < *(int *)(in_RDI + 0x78)) {
    peVar1 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x116857);
    (*peVar1->DevClose)(*(DEV_HANDLE *)(in_RDI + 0x80));
    this_00 = std::__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x11689f);
    Interface::close(this_00,in_ESI);
  }
  std::vector<std::weak_ptr<rcg::Stream>,_std::allocator<std::weak_ptr<rcg::Stream>_>_>::~vector
            (in_stack_fffffffffffffff0);
  std::shared_ptr<GenApi_3_4::CEventAdapterGeneric>::~shared_ptr
            ((shared_ptr<GenApi_3_4::CEventAdapterGeneric> *)0x1168cd);
  std::shared_ptr<GenApi_3_4::CNodeMapRef>::~shared_ptr
            ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x1168de);
  std::shared_ptr<GenApi_3_4::CNodeMapRef>::~shared_ptr
            ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x1168ef);
  std::shared_ptr<rcg::CPort>::~shared_ptr((shared_ptr<rcg::CPort> *)0x116900);
  std::shared_ptr<rcg::CPort>::~shared_ptr((shared_ptr<rcg::CPort> *)0x116911);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffff0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffff0);
  std::__cxx11::string::~string((string *)(in_RDI + 0x30));
  std::shared_ptr<const_rcg::GenTLWrapper>::~shared_ptr
            ((shared_ptr<const_rcg::GenTLWrapper> *)0x11694f);
  std::shared_ptr<rcg::Interface>::~shared_ptr((shared_ptr<rcg::Interface> *)0x11695d);
  std::enable_shared_from_this<rcg::Device>::~enable_shared_from_this
            ((enable_shared_from_this<rcg::Device> *)0x116967);
  return;
}

Assistant:

Device::~Device()
{
  if (n_open > 0)
  {
    try
    {
      gentl->DevClose(dev);
    }
    catch (...) // do not throw exceptions in destructor
    { }

    parent->close();
  }
}